

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O2

optional<bidfx_public_api::price::pixie::SubscriptionSync> * __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync
          (optional<bidfx_public_api::price::pixie::SubscriptionSync> *__return_storage_ptr__,
          SubjectSetRegister *this)

{
  bool bVar1;
  long lVar2;
  iterator iVar3;
  int edition;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subject_set;
  unique_lock<std::mutex> lck;
  SubscriptionSync result;
  int local_ac;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_a8;
  unique_lock<std::mutex> local_90;
  undefined1 local_80 [104];
  
  std::unique_lock<std::mutex>::unique_lock(&local_90,&this->mutex_);
  if (this->modified_ == false) {
    (__return_storage_ptr__->
    super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>)._M_payload
    .super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
    super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged =
         false;
    goto LAB_001c9451;
  }
  this->modified_ = false;
  CurrentSubjectSetSorted(&local_a8,this);
  if ((this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_ac = 0;
  }
  else {
    lVar2 = std::_Rb_tree_decrement
                      (&(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header);
    local_ac = *(int *)(lVar2 + 0x20);
  }
  iVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
          ::find(&(this->subject_set_cache_)._M_t,&local_ac);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header) {
LAB_001c93e3:
    local_ac = local_ac + 1;
    std::
    make_shared<bidfx_public_api::price::pixie::EditionData,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>&>
              ((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                *)local_80);
    std::
    map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
    ::insert_or_assign<std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>
              ((map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
                *)&this->subject_set_cache_,&local_ac,
               (shared_ptr<bidfx_public_api::price::pixie::EditionData> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    CreateSubscriptionSync((SubscriptionSync *)local_80,this,local_ac,&local_a8);
    CleanUnsubscribeState(this);
    std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::
    _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
              ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
               __return_storage_ptr__,local_80);
  }
  else {
    bVar1 = std::operator==(&local_a8,
                            (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                             *)iVar3._M_node[1]._M_parent);
    if (!bVar1) goto LAB_001c93e3;
    CreateSubscriptionSync((SubscriptionSync *)local_80,this,local_ac,&local_a8);
    bVar1 = SubscriptionSync::HasControls((SubscriptionSync *)local_80);
    if (bVar1) {
      SubscriptionSync::SetChangedEdition((SubscriptionSync *)local_80,false);
      std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::
      _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
                 __return_storage_ptr__,local_80);
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>).
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged =
           false;
    }
  }
  SubscriptionSync::~SubscriptionSync((SubscriptionSync *)local_80);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_a8);
LAB_001c9451:
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::optional<SubscriptionSync> SubjectSetRegister::NextSubscriptionSync()
{
    std::unique_lock<std::mutex> lck(mutex_);
    if (!modified_) { return {}; }
    modified_ = false;

    std::vector<Subject> subject_set = CurrentSubjectSetSorted();
    int edition = subject_set_cache_.empty() ? 0 : subject_set_cache_.rbegin()->first;
    auto edition_data = subject_set_cache_.find(edition);

    if (edition_data != subject_set_cache_.end() && subject_set == edition_data->second->GetSubjects())
    {
        SubscriptionSync subscription_sync = CreateSubscriptionSync(edition, subject_set);
        if (!subscription_sync.HasControls())
        {
            return {};
        }
        subscription_sync.SetChangedEdition(false);
        return std::move(subscription_sync);
    }

    subject_set_cache_.insert_or_assign(++edition, std::make_shared<EditionData>(subject_set));
    SubscriptionSync result = CreateSubscriptionSync(edition, subject_set);
    CleanUnsubscribeState();
    return std::move(result);
}